

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_base.cpp
# Opt level: O3

void __thiscall zmq::session_base_t::timer_event(session_base_t *this,int id_)

{
  pipe_t *in_RAX;
  pipe_t *this_00;
  
  if (id_ != 0x20) {
    timer_event();
  }
  this->_has_linger_timer = false;
  this_00 = this->_pipe;
  if (this->_pipe == (pipe_t *)0x0) {
    timer_event();
    this_00 = in_RAX;
  }
  pipe_t::terminate(this_00,false);
  return;
}

Assistant:

void zmq::session_base_t::timer_event (int id_)
{
    //  Linger period expired. We can proceed with termination even though
    //  there are still pending messages to be sent.
    zmq_assert (id_ == linger_timer_id);
    _has_linger_timer = false;

    //  Ask pipe to terminate even though there may be pending messages in it.
    zmq_assert (_pipe);
    _pipe->terminate (false);
}